

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O1

void __thiscall
dgrminer::PartialUnion::removeInfrequentEdges
          (PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
          *edges_set,int support_as_absolute,bool set_of_graphs,bool debugPrint)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  array<int,_8UL> *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined4 **ppuVar8;
  long lVar9;
  pointer paVar10;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  _Var11;
  pointer paVar12;
  undefined4 **ppuVar13;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  _Var14;
  pointer paVar15;
  int count;
  undefined1 local_1c8 [24];
  _Base_ptr local_1b0;
  _Base_ptr p_Stack_1a8;
  undefined4 *local_1a0;
  undefined8 uStack_198;
  PartialUnion *local_190;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_188;
  undefined1 local_180 [24];
  _Base_ptr p_Stack_168;
  _Base_ptr local_160;
  undefined4 *local_158;
  undefined8 uStack_150;
  PartialUnion *local_148;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_140;
  undefined1 local_138 [16];
  _Base_ptr p_Stack_128;
  _Base_ptr local_120;
  undefined4 *local_118;
  undefined8 uStack_110;
  PartialUnion *local_108;
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_100;
  undefined4 local_f4;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_f0;
  _Rb_tree_color local_e8;
  _Base_ptr local_e0 [3];
  undefined4 *local_c8;
  undefined8 uStack_c0;
  PartialUnion *local_b8;
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  local_b0;
  int local_80;
  undefined4 uStack_7c;
  PartialUnion *pPStack_78;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_70;
  _Rb_tree_color local_68;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_60;
  undefined4 *local_48;
  undefined1 uStack_40;
  undefined7 uStack_3f;
  PartialUnion *local_38;
  
  local_f4 = 0;
  paVar12 = (this->edges).
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  paVar15 = (this->edges).
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_188 = newedges;
  local_100 = &edges_set->_M_t;
  local_70 = edges_set;
  local_68 = support_as_absolute;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_60,newedges);
  local_138._0_4_ = local_68;
  local_140 = local_70;
  local_48 = &local_f4;
  uStack_40 = set_of_graphs;
  local_38 = this;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)(local_138 + 8)
             ,&local_60);
  local_160 = local_120;
  p_Stack_168 = p_Stack_128;
  local_180._16_8_ = local_138._8_8_;
  local_108 = local_38;
  uStack_110 = CONCAT71(uStack_3f,uStack_40);
  local_118 = local_48;
  local_180._0_8_ = local_140;
  local_180._8_4_ = local_138._0_4_;
  local_138._8_8_ = (_Base_ptr)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)0x0;
  local_148 = local_38;
  uStack_150 = CONCAT71(uStack_3f,uStack_40);
  local_158 = local_48;
  _Var11._M_current = (array<int,_8UL> *)local_e0;
  local_e8 = local_138._0_4_;
  local_f0 = local_140;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             _Var11._M_current,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_180 + 0x10));
  ppuVar13 = &local_158;
  local_b8 = local_148;
  local_c8 = local_158;
  uStack_c0 = uStack_150;
  local_1c8._8_4_ = local_e8;
  local_1c8._0_8_ = local_f0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_1c8 + 0x10),
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             _Var11._M_current);
  local_190 = local_b8;
  local_1a0 = local_c8;
  uStack_198 = uStack_c0;
  lVar9 = (long)paVar15 - (long)paVar12 >> 7;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c8,_Var11);
      paVar10 = paVar12;
      if (bVar7) goto LAB_0012c82c;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c8,_Var11);
      if (bVar7) {
        paVar10 = paVar12 + 1;
        goto LAB_0012c82c;
      }
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c8,_Var11);
      if (bVar7) {
        paVar10 = paVar12 + 2;
        goto LAB_0012c82c;
      }
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c8,_Var11);
      if (bVar7) {
        paVar10 = paVar12 + 3;
        goto LAB_0012c82c;
      }
      paVar12 = paVar12 + 4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)paVar15 - (long)paVar12 >> 5;
  if (lVar9 == 1) {
LAB_0012c807:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1c8,_Var11);
    paVar10 = paVar12;
    if (!bVar7) {
      paVar10 = paVar15;
    }
  }
  else if (lVar9 == 2) {
LAB_0012c7f5:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1c8,_Var11);
    paVar10 = paVar12;
    if (!bVar7) {
      paVar12 = paVar12 + 1;
      goto LAB_0012c807;
    }
  }
  else {
    paVar10 = paVar15;
    if ((lVar9 == 3) &&
       (bVar7 = __gnu_cxx::__ops::
                _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
                ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                              *)local_1c8,_Var11), paVar10 = paVar12, !bVar7)) {
      paVar12 = paVar12 + 1;
      goto LAB_0012c7f5;
    }
  }
LAB_0012c82c:
  if ((_Base_ptr)local_1c8._16_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_1c8._16_8_);
  }
  if (local_e0[0] != (_Base_ptr)0x0) {
    operator_delete(local_e0[0]);
  }
  paVar12 = paVar10 + 1;
  if (paVar12 != paVar15 && paVar10 != paVar15) {
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_180,_Var11);
      if (!bVar7) {
        uVar4 = *(undefined8 *)paVar12->_M_elems;
        uVar5 = *(undefined8 *)(paVar12->_M_elems + 2);
        uVar6 = *(undefined8 *)(paVar12->_M_elems + 6);
        *(undefined8 *)(paVar10->_M_elems + 4) = *(undefined8 *)(paVar12->_M_elems + 4);
        *(undefined8 *)(paVar10->_M_elems + 6) = uVar6;
        *(undefined8 *)paVar10->_M_elems = uVar4;
        *(undefined8 *)(paVar10->_M_elems + 2) = uVar5;
        paVar10 = paVar10 + 1;
      }
      paVar12 = paVar12 + 1;
    } while (paVar12 != paVar15);
  }
  if ((_Base_ptr)local_180._16_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_180._16_8_);
  }
  if ((_Base_ptr)local_138._8_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_138._8_8_);
  }
  paVar12 = (this->edges).
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if ((paVar10 != paVar12) &&
     (paVar15 = (this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish,
     paVar10 = (pointer)((long)paVar10 + ((long)paVar15 - (long)paVar12)), paVar15 != paVar10)) {
    (this->edges).super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = paVar10;
  }
  if (local_60.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  _Var11._M_current =
       (local_188->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (local_188->
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree(&local_b0,local_100);
  uStack_7c = CONCAT31(uStack_7c._1_3_,set_of_graphs);
  local_80 = support_as_absolute;
  pPStack_78 = this;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_140,&local_b0);
  uStack_110 = CONCAT44(uStack_7c,local_80);
  local_108 = pPStack_78;
  p_Var1 = (_Base_ptr)(local_1c8 + 8);
  if ((_Base_ptr)local_138._8_8_ == (_Base_ptr)0x0) {
    ppuVar8 = &local_1a0;
    local_1c8._8_4_ = _S_red;
    local_1c8._16_8_ = (_Base_ptr)0x0;
    local_1b0 = p_Var1;
    p_Stack_1a8 = p_Var1;
  }
  else {
    local_1c8._8_4_ = local_138._0_4_;
    local_1c8._16_8_ = local_138._8_8_;
    local_1b0 = p_Stack_128;
    p_Stack_1a8 = local_120;
    *(_Base_ptr *)(local_138._8_8_ + 8) = p_Var1;
    ppuVar8 = &local_118;
    local_1a0 = local_118;
    local_138._8_8_ = (_Base_ptr)0x0;
    p_Stack_128 = (_Base_ptr)local_138;
    local_120 = (_Base_ptr)local_138;
  }
  *ppuVar8 = (undefined4 *)0x0;
  local_190 = pPStack_78;
  p_Var2 = (_Base_ptr)(local_180 + 8);
  if ((_Base_ptr)local_1c8._16_8_ == (_Base_ptr)0x0) {
    local_180._8_4_ = _S_red;
    local_180._16_8_ = (_Base_ptr)0x0;
    p_Stack_168 = p_Var2;
    local_160 = p_Var2;
  }
  else {
    ppuVar13 = &local_1a0;
    local_180._8_4_ = local_1c8._8_4_;
    local_180._16_8_ = local_1c8._16_8_;
    p_Stack_168 = local_1b0;
    local_160 = p_Stack_1a8;
    *(_Base_ptr *)(local_1c8._16_8_ + 8) = p_Var2;
    local_158 = local_1a0;
    local_1c8._16_8_ = (_Base_ptr)0x0;
    local_1b0 = p_Var1;
    p_Stack_1a8 = p_Var1;
  }
  uStack_198 = uStack_110;
  *ppuVar13 = (undefined4 *)0x0;
  uStack_150 = uStack_198;
  local_148 = local_190;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_1c8);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_f0,
             (_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)local_180);
  uStack_c0 = uStack_150;
  local_b8 = local_148;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)local_1c8,
             (_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_f0);
  uStack_198 = uStack_c0;
  local_190 = local_b8;
  lVar9 = (long)paVar3 - (long)_Var11._M_current >> 7;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c8,_Var11);
      _Var14._M_current = _Var11._M_current;
      if (bVar7) goto LAB_0012cb56;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c8,_Var11._M_current + 1);
      _Var14._M_current = _Var11._M_current + 1;
      if (bVar7) goto LAB_0012cb56;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c8,_Var11._M_current + 2);
      _Var14._M_current = _Var11._M_current + 2;
      if (bVar7) goto LAB_0012cb56;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c8,_Var11._M_current + 3);
      _Var14._M_current = _Var11._M_current + 3;
      if (bVar7) goto LAB_0012cb56;
      _Var11._M_current = _Var11._M_current + 4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)paVar3 - (long)_Var11._M_current >> 5;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      _Var14._M_current = paVar3;
      if ((lVar9 != 3) ||
         (bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
                  ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                                *)local_1c8,_Var11), _Var14._M_current = _Var11._M_current, bVar7))
      goto LAB_0012cb56;
      _Var11._M_current = _Var11._M_current + 1;
    }
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                          *)local_1c8,_Var11);
    _Var14._M_current = _Var11._M_current;
    if (bVar7) goto LAB_0012cb56;
    _Var11._M_current = _Var11._M_current + 1;
  }
  bVar7 = __gnu_cxx::__ops::
          _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
          ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                        *)local_1c8,_Var11);
  _Var14._M_current = _Var11._M_current;
  if (!bVar7) {
    _Var14._M_current = paVar3;
  }
LAB_0012cb56:
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_1c8);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)&local_f0);
  _Var11._M_current = _Var14._M_current + 1;
  if (_Var11._M_current != paVar3 && _Var14._M_current != paVar3) {
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_180,_Var11);
      if (!bVar7) {
        uVar4 = *(undefined8 *)(_Var11._M_current)->_M_elems;
        uVar5 = *(undefined8 *)((_Var11._M_current)->_M_elems + 2);
        uVar6 = *(undefined8 *)((_Var11._M_current)->_M_elems + 6);
        *(undefined8 *)((_Var14._M_current)->_M_elems + 4) =
             *(undefined8 *)((_Var11._M_current)->_M_elems + 4);
        *(undefined8 *)((_Var14._M_current)->_M_elems + 6) = uVar6;
        *(undefined8 *)(_Var14._M_current)->_M_elems = uVar4;
        *(undefined8 *)((_Var14._M_current)->_M_elems + 2) = uVar5;
        _Var14._M_current = _Var14._M_current + 1;
      }
      _Var11._M_current = _Var11._M_current + 1;
    } while (_Var11._M_current != paVar3);
  }
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_180);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)&local_140);
  paVar3 = (local_188->
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if ((_Var14._M_current != paVar3) &&
     (paVar12 = (local_188->
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
                _M_impl.super__Vector_impl_data._M_finish,
     paVar15 = (pointer)((long)_Var14._M_current + ((long)paVar12 - (long)paVar3)),
     paVar12 != paVar15)) {
    (local_188->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar15;
  }
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree(&local_b0);
  return;
}

Assistant:

void PartialUnion::removeInfrequentEdges(std::vector<std::array<int, 8>> & newedges, std::set<labeled_edge_with_occurrences> & edges_set,
		int support_as_absolute, bool set_of_graphs, bool debugPrint = false)
	{
		int count = 0;
		edges.erase(std::remove_if(std::begin(edges), std::end(edges), [&edges_set, support_as_absolute, newedges, &count, set_of_graphs, this](array<int, 8> edge) mutable {
			std::array<int, 8> ne = newedges[count];
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(ne);
			++count;

		  	std::set<labeled_edge_with_occurrences>::iterator it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}

				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				// only change edges can be infrequent (i.e. any of their changetimes >= 0)
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(edges));


		newedges.erase(std::remove_if(std::begin(newedges), std::end(newedges), [edges_set, support_as_absolute, set_of_graphs, this](array<int, 8> edge) {
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(edge);

			auto it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}
				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(newedges));
	}